

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  int iVar1;
  int new_capacity;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ImGuiStoragePair *pIVar7;
  
  pIVar7 = this->Data;
  if (pIVar7 <= it) {
    iVar1 = this->Size;
    lVar4 = (long)iVar1;
    if (it <= pIVar7 + lVar4) {
      lVar6 = (long)it - (long)pIVar7;
      if (iVar1 == this->Capacity) {
        if (iVar1 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar1 / 2 + iVar1;
        }
        new_capacity = iVar1 + 1;
        if (iVar1 + 1 < iVar3) {
          new_capacity = iVar3;
        }
        reserve(this,new_capacity);
        lVar4 = (long)this->Size;
        pIVar7 = this->Data;
      }
      lVar5 = lVar4 - (lVar6 >> 4);
      if (lVar5 != 0 && lVar6 >> 4 <= lVar4) {
        memmove((void *)((long)pIVar7 + lVar6 + 0x10),(void *)((long)pIVar7 + lVar6),lVar5 * 0x10);
        pIVar7 = this->Data;
      }
      aVar2 = v->field_1;
      *(undefined8 *)((long)pIVar7 + lVar6) = *(undefined8 *)v;
      *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)((undefined8 *)((long)pIVar7 + lVar6) + 1)
           = aVar2;
      this->Size = this->Size + 1;
      return (ImGuiStoragePair *)(lVar6 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                ,0x500,
                "T *ImVector<ImGuiStorage::ImGuiStoragePair>::insert(const T *, const T &) [T = ImGuiStorage::ImGuiStoragePair]"
               );
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }